

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool __thiscall
re2::Regexp::ParseState::ParseCharClass
          (ParseState *this,StringPiece *s,Regexp **out_re,RegexpStatus *status)

{
  char *pcVar1;
  char cVar2;
  re2 rVar3;
  ParseFlags parse_flags;
  const_pointer pcVar4;
  size_type sVar5;
  re2 *this_00;
  byte bVar6;
  StringPiece *pSVar7;
  bool bVar8;
  ParseStatus PVar9;
  int iVar10;
  Regexp *this_01;
  CharClassBuilder *this_02;
  UGroup *pUVar11;
  ulong uVar12;
  StringPiece *name;
  RuneRange rr;
  Rune r;
  StringPiece whole_class;
  StringPiece local_78;
  CharClassBuilder *local_60;
  Regexp **local_58;
  Rune local_4c;
  StringPiece local_48;
  
  local_48.data_ = s->data_;
  local_48.size_ = s->size_;
  if ((s->size_ == 0) || (*s->data_ != '[')) {
    status->code_ = kRegexpInternalError;
    (status->error_arg_).data_ = (const_pointer)0x0;
    (status->error_arg_).size_ = 0;
    return false;
  }
  this_01 = (Regexp *)operator_new(0x28);
  Regexp(this_01,kRegexpCharClass,
         this->flags_ &
         (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|NonGreedy|Latin1|
          OneLine|MatchNL|Literal));
  local_58 = out_re;
  this_02 = (CharClassBuilder *)operator_new(0x40);
  CharClassBuilder::CharClassBuilder(this_02);
  (this_01->field_7).field_3.ccb_ = this_02;
  pcVar4 = s->data_;
  sVar5 = s->size_;
  pcVar1 = pcVar4 + 1;
  s->data_ = pcVar1;
  uVar12 = sVar5 - 1;
  s->size_ = uVar12;
  if (uVar12 != 0) {
    cVar2 = *pcVar1;
    if (cVar2 == '^') {
      s->data_ = pcVar4 + 2;
      uVar12 = sVar5 - 2;
      s->size_ = uVar12;
      if ((this->flags_ & (NeverNL|ClassNL)) != ClassNL) {
        CharClassBuilder::AddRange(this_02,10,10);
        uVar12 = s->size_;
      }
      if (uVar12 == 0) goto LAB_001c06ff;
    }
    bVar6 = 1;
    do {
      this_00 = (re2 *)s->data_;
      rVar3 = *this_00;
      if ((bool)(~bVar6 & rVar3 == (re2)0x5d)) {
        s->data_ = (const_pointer)(this_00 + 1);
        s->size_ = uVar12 - 1;
        if (cVar2 == '^') {
          CharClassBuilder::Negate((this_01->field_7).field_3.ccb_);
        }
        *local_58 = this_01;
        return true;
      }
      if ((bool)(bVar6 | rVar3 != (re2)0x2d)) {
        if ((((rVar3 == (re2)0x5b && 2 < uVar12) && (this_00[1] == (re2)0x3a)) && (1 < (long)uVar12)
            ) && (3 < uVar12)) {
          parse_flags = this->flags_;
          name = (StringPiece *)0x4;
          do {
            if (((this_00 + -2)[(long)name] == (re2)0x3a) &&
               ((this_00 + -1)[(long)name] == (re2)0x5d)) {
              local_60 = (this_01->field_7).field_3.ccb_;
              pUVar11 = LookupGroup(this_00,name,(UGroup *)posix_groups,0x1c);
              if (pUVar11 == (UGroup *)0x0) {
                status->code_ = kRegexpBadCharRange;
                (status->error_arg_).data_ = (const_pointer)this_00;
                (status->error_arg_).size_ = (size_type)name;
                goto LAB_001c0713;
              }
              s->data_ = (const_pointer)(this_00 + (long)name);
              s->size_ = uVar12 - (long)name;
              AddUGroup(local_60,pUVar11,pUVar11->sign,parse_flags);
              goto LAB_001c068d;
            }
            pSVar7 = name + -1;
            name = (StringPiece *)((long)&name->data_ + 1);
          } while (this_00 + (long)((long)&pSVar7->size_ + 7) <= this_00 + (uVar12 - 2));
        }
        if ((rVar3 != (re2)0x5c || uVar12 < 3) || (((byte)this_00[1] | 0x20) != 0x70))
        goto LAB_001c0624;
        PVar9 = ParseUnicodeGroup(s,this->flags_,(this_01->field_7).field_3.ccb_,status);
        if (PVar9 != kParseOk) {
          if (PVar9 != kParseError) goto LAB_001c0624;
          goto LAB_001c0713;
        }
      }
      else {
        if (((this->flags_ & PerlX) == NoParseFlags) && ((uVar12 == 1 || (this_00[1] != (re2)0x5d)))
           ) {
          local_78.data_ = s->data_ + 1;
          local_78.size_ = s->size_ - 1;
          iVar10 = StringPieceToRune(&local_4c,&local_78,status);
          if (-1 < iVar10) {
            status->code_ = kRegexpBadCharRange;
            (status->error_arg_).data_ = s->data_;
            (status->error_arg_).size_ = (ulong)(iVar10 + 1);
          }
          goto LAB_001c0713;
        }
LAB_001c0624:
        pUVar11 = MaybeParsePerlCCEscape(s,this->flags_);
        if (pUVar11 == (UGroup *)0x0) {
          local_78.data_ = (const_pointer)0x0;
          bVar8 = ParseCCRange(this,s,(RuneRange *)&local_78,&local_48,status);
          if (!bVar8) goto LAB_001c0713;
          CharClassBuilder::AddRangeFlags
                    ((this_01->field_7).field_3.ccb_,(Rune)local_78.data_,local_78.data_._4_4_,
                     this->flags_ | ClassNL);
        }
        else {
          AddUGroup((this_01->field_7).field_3.ccb_,pUVar11,pUVar11->sign,this->flags_);
        }
      }
LAB_001c068d:
      uVar12 = s->size_;
      bVar6 = 0;
    } while (uVar12 != 0);
  }
LAB_001c06ff:
  status->code_ = kRegexpMissingBracket;
  (status->error_arg_).data_ = local_48.data_;
  (status->error_arg_).size_ = local_48.size_;
LAB_001c0713:
  Decref(this_01);
  return false;
}

Assistant:

bool Regexp::ParseState::ParseCharClass(StringPiece* s,
                                        Regexp** out_re,
                                        RegexpStatus* status) {
  StringPiece whole_class = *s;
  if (s->size() == 0 || (*s)[0] != '[') {
    // Caller checked this.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(StringPiece());
    return false;
  }
  bool negated = false;
  Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
  re->ccb_ = new CharClassBuilder;
  s->remove_prefix(1);  // '['
  if (s->size() > 0 && (*s)[0] == '^') {
    s->remove_prefix(1);  // '^'
    negated = true;
    if (!(flags_ & ClassNL) || (flags_ & NeverNL)) {
      // If NL can't match implicitly, then pretend
      // negated classes include a leading \n.
      re->ccb_->AddRange('\n', '\n');
    }
  }
  bool first = true;  // ] is okay as first char in class
  while (s->size() > 0 && ((*s)[0] != ']' || first)) {
    // - is only okay unescaped as first or last in class.
    // Except that Perl allows - anywhere.
    if ((*s)[0] == '-' && !first && !(flags_&PerlX) &&
        (s->size() == 1 || (*s)[1] != ']')) {
      StringPiece t = *s;
      t.remove_prefix(1);  // '-'
      Rune r;
      int n = StringPieceToRune(&r, &t, status);
      if (n < 0) {
        re->Decref();
        return false;
      }
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(StringPiece(s->data(), 1+n));
      re->Decref();
      return false;
    }
    first = false;

    // Look for [:alnum:] etc.
    if (s->size() > 2 && (*s)[0] == '[' && (*s)[1] == ':') {
      switch (ParseCCName(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Unicode character group like \p{Han}
    if (s->size() > 2 &&
        (*s)[0] == '\\' &&
        ((*s)[1] == 'p' || (*s)[1] == 'P')) {
      switch (ParseUnicodeGroup(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Perl character class symbols (extension).
    const UGroup *g = MaybeParsePerlCCEscape(s, flags_);
    if (g != NULL) {
      AddUGroup(re->ccb_, g, g->sign, flags_);
      continue;
    }

    // Otherwise assume single character or simple range.
    RuneRange rr;
    if (!ParseCCRange(s, &rr, whole_class, status)) {
      re->Decref();
      return false;
    }
    // AddRangeFlags is usually called in response to a class like
    // \p{Foo} or [[:foo:]]; for those, it filters \n out unless
    // Regexp::ClassNL is set.  In an explicit range or singleton
    // like we just parsed, we do not filter \n out, so set ClassNL
    // in the flags.
    re->ccb_->AddRangeFlags(rr.lo, rr.hi, flags_ | Regexp::ClassNL);
  }
  if (s->size() == 0) {
    status->set_code(kRegexpMissingBracket);
    status->set_error_arg(whole_class);
    re->Decref();
    return false;
  }
  s->remove_prefix(1);  // ']'

  if (negated)
    re->ccb_->Negate();

  *out_re = re;
  return true;
}